

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

void Imath_3_2::extractEulerZYX<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vec3<float> local_88;
  Vec3<float> local_78;
  Vec3<float> local_68;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_68.z = mat->x[0][2];
  uVar5 = 0;
  local_68._0_8_ = *(undefined8 *)mat->x[0];
  local_78.z = mat->x[1][2];
  local_78._0_8_ = *(undefined8 *)mat->x[1];
  local_88.z = mat->x[2][2];
  local_88._0_8_ = *(undefined8 *)mat->x[2];
  fVar3 = (float)((ulong)local_68._0_8_ >> 0x20);
  fVar3 = local_68.z * local_68.z + (float)local_68._0_8_ * (float)local_68._0_8_ + fVar3 * fVar3;
  if (fVar3 < 2.3509887e-38) {
    fVar3 = Vec3<float>::lengthTiny(&local_68);
    uVar5 = extraout_XMM0_Db_02;
  }
  else if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    uVar5 = extraout_XMM0_Db;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_68.x;
    auVar8._4_4_ = local_68.y;
    auVar9._4_4_ = fVar3;
    auVar9._0_4_ = fVar3;
    auVar9._8_4_ = uVar5;
    auVar9._12_4_ = uVar5;
    auVar9 = divps(auVar8,auVar9);
    local_68._0_8_ = auVar9._0_8_;
    local_68.z = local_68.z / fVar3;
  }
  uVar5 = 0;
  fVar3 = local_78.z * local_78.z + local_78.x * local_78.x + local_78.y * local_78.y;
  if (fVar3 < 2.3509887e-38) {
    fVar3 = Vec3<float>::lengthTiny(&local_78);
    uVar5 = extraout_XMM0_Db_03;
  }
  else if (0.0 <= fVar3) {
    fVar3 = SQRT(fVar3);
  }
  else {
    fVar3 = sqrtf(fVar3);
    uVar5 = extraout_XMM0_Db_00;
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar10._8_8_ = 0;
    auVar10._0_4_ = local_78.x;
    auVar10._4_4_ = local_78.y;
    auVar1._4_4_ = fVar3;
    auVar1._0_4_ = fVar3;
    auVar1._8_4_ = uVar5;
    auVar1._12_4_ = uVar5;
    auVar9 = divps(auVar10,auVar1);
    local_78._0_8_ = auVar9._0_8_;
    local_78.z = local_78.z / fVar3;
  }
  uVar5 = 0;
  fVar3 = local_88.z * local_88.z + local_88.x * local_88.x + local_88.y * local_88.y;
  if (fVar3 < 2.3509887e-38) {
    fVar3 = Vec3<float>::lengthTiny(&local_88);
    uVar5 = extraout_XMM0_Db_04;
  }
  else if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    uVar5 = extraout_XMM0_Db_01;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar11._8_8_ = 0;
    auVar11._0_4_ = local_88.x;
    auVar11._4_4_ = local_88.y;
    auVar2._4_4_ = fVar3;
    auVar2._0_4_ = fVar3;
    auVar2._8_4_ = uVar5;
    auVar2._12_4_ = uVar5;
    auVar9 = divps(auVar11,auVar2);
    local_88._0_8_ = auVar9._0_8_;
    local_88.z = local_88.z / fVar3;
  }
  local_3c = local_68.x;
  local_50 = local_68.y;
  local_44 = local_68.z;
  local_40 = local_78.x;
  local_58 = local_78.y;
  local_4c = local_78.z;
  local_18 = ZEXT416((uint)local_88.x);
  local_54 = local_88.y;
  local_48 = local_88.z;
  local_38 = atan2f(local_78.x,local_68.x);
  rot->x = -local_38;
  local_28._0_4_ = cosf(local_38);
  fVar3 = sinf(local_38);
  fVar16 = (float)local_28._0_4_ * 0.0 * 0.0 - fVar3;
  fVar3 = fVar3 * 0.0;
  fVar13 = fVar3 * 0.0 + (float)local_28._0_4_;
  fVar6 = (float)local_28._0_4_ * 0.0 + fVar3;
  fVar3 = (float)local_28._0_4_ * -0.0 + fVar3;
  fVar12 = fVar13 * 0.0;
  fVar4 = fVar16 + fVar12 + 0.0;
  fVar16 = fVar16 * 0.0;
  fVar14 = fVar13 + fVar16 + 0.0;
  fVar15 = fVar3 * 0.0;
  fVar13 = fVar6 * 0.0;
  fVar7 = fVar13 + fVar15;
  fVar12 = fVar16 + fVar12 + 0.0;
  local_38 = fVar12 * local_54 + fVar4 * local_50 + local_58 * fVar14 + fVar12 * 0.0;
  local_28 = ZEXT416((uint)(fVar12 * local_48 + fVar4 * local_44 + fVar14 * local_4c + fVar12 * 0.0)
                    );
  fVar6 = fVar6 + fVar15 + 0.0;
  fVar12 = fVar3 + fVar13 + 0.0;
  fVar3 = fVar7 + 1.0;
  fVar4 = (fVar7 + 0.0) * 0.0;
  local_18._0_4_ = (float)local_18._0_4_ * fVar3 + local_3c * fVar6 + local_40 * fVar12 + fVar4;
  fVar13 = local_54 * fVar3 + local_50 * fVar6 + local_58 * fVar12 + fVar4;
  fVar4 = fVar3 * local_48 + fVar6 * local_44 + fVar12 * local_4c + fVar4;
  fVar3 = fVar4 * fVar4 + fVar13 * fVar13;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = atan2f(-(float)local_18._0_4_,fVar3);
  rot->y = -fVar3;
  fVar3 = atan2f(-(float)local_28._0_4_,local_38);
  rot->z = -fVar3;
  return;
}

Assistant:

void
extractEulerZYX (const Matrix44<T>& mat, Vec3<T>& rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize ();
    j.normalize ();
    k.normalize ();

    Matrix44<T> M (
        i[0],
        i[1],
        i[2],
        0,
        j[0],
        j[1],
        j[2],
        0,
        k[0],
        k[1],
        k[2],
        0,
        0,
        0,
        0,
        1);

    //
    // Extract the first angle, rot.x.
    //

    rot.x = -std::atan2 (M[1][0], M[0][0]);

    //
    // Remove the x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (0, 0, -rot.x));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy  = std::sqrt (N[2][2] * N[2][2] + N[2][1] * N[2][1]);
    rot.y = -std::atan2 (-N[2][0], cy);
    rot.z = -std::atan2 (-N[1][2], N[1][1]);
}